

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall jbcoin::STObject::setFieldV256(STObject *this,SField *field,STVector256 *v)

{
  STVector256 local_48;
  STVector256 *local_20;
  STVector256 *v_local;
  SField *field_local;
  STObject *this_local;
  
  local_20 = v;
  v_local = (STVector256 *)field;
  field_local = (SField *)this;
  STVector256::STVector256(&local_48,v);
  setFieldUsingSetValue<jbcoin::STVector256,jbcoin::STVector256>(this,field,&local_48);
  STVector256::~STVector256(&local_48);
  return;
}

Assistant:

void STObject::setFieldV256 (SField const& field, STVector256 const& v)
{
    setFieldUsingSetValue <STVector256> (field, v);
}